

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  handle *handle;
  PyObject *pPVar5;
  long *plVar6;
  undefined8 *puVar7;
  char *pcVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  size_type *psVar12;
  uint __len;
  undefined8 uVar13;
  string *in_RDI;
  PyTypeObject *pPVar14;
  size_type __dnew;
  string __str;
  error_scope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [24];
  object oStack_150;
  long *local_148;
  undefined8 local_140;
  long local_138;
  undefined8 uStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  error_scope local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  handle local_60;
  handle local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = PyErr_Occurred();
  if (lVar4 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_188._M_dataplus._M_p = (pointer)0x1f;
    pcVar8 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_188);
    (in_RDI->_M_dataplus)._M_p = pcVar8;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    builtin_strncpy(pcVar8,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(&local_e8,&local_e8.value,&local_e8.trace);
    local_68 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_68;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_90 = in_RDI;
    if (local_e8.type != (PyObject *)0x0) {
      local_168._8_8_ = local_e8.type;
      local_168._16_8_ = "__name__";
      oStack_150.super_handle.m_ptr = (handle)(PyObject *)0x0;
      handle = &accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_168)->
                super_handle;
      cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_188,handle);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      object::~object(&oStack_150);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_e8.value != (PyObject *)0x0) {
      local_168._0_8_ = PyObject_Str();
      str::operator_cast_to_string(&local_188,(str *)local_168);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      object::~object((object *)local_168);
    }
    PyErr_NormalizeException(&local_e8,&local_e8.value,&local_e8.trace);
    if (local_e8.trace != (PyObject *)0x0) {
      PyException_SetTraceback(local_e8.value);
    }
    if (local_e8.trace != (PyObject *)0x0) {
      do {
        pPVar5 = local_e8.trace;
        local_e8.trace = (PyObject *)pPVar5[1].ob_refcnt;
      } while (local_e8.trace != (PyObject *)0x0);
      pPVar14 = pPVar5[1].ob_type;
      std::__cxx11::string::append((char *)in_RDI);
      if (pPVar14 != (PyTypeObject *)0x0) {
        do {
          uVar2 = PyFrame_GetLineNumber(pPVar14);
          local_58.m_ptr = *(PyObject **)(pPVar14->tp_basicsize + 0x68);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_50,&local_58);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x114f50);
          plVar9 = plVar6 + 2;
          if ((long *)*plVar6 == plVar9) {
            local_78 = *plVar9;
            lStack_70 = plVar6[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar9;
            local_88 = (long *)*plVar6;
          }
          local_80 = plVar6[1];
          *plVar6 = (long)plVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
          puVar10 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar10) {
            local_f8 = *puVar10;
            lStack_f0 = plVar6[3];
            local_108 = &local_f8;
          }
          else {
            local_f8 = *puVar10;
            local_108 = (ulong *)*plVar6;
          }
          local_100 = plVar6[1];
          *plVar6 = (long)puVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          __val = -uVar2;
          if (0 < (int)uVar2) {
            __val = uVar2;
          }
          __len = 1;
          if (9 < __val) {
            uVar11 = (ulong)__val;
            uVar1 = 4;
            do {
              __len = uVar1;
              uVar3 = (uint)uVar11;
              if (uVar3 < 100) {
                __len = __len - 2;
                goto LAB_00108cdb;
              }
              if (uVar3 < 1000) {
                __len = __len - 1;
                goto LAB_00108cdb;
              }
              if (uVar3 < 10000) goto LAB_00108cdb;
              uVar11 = uVar11 / 10000;
              uVar1 = __len + 4;
            } while (99999 < uVar3);
            __len = __len + 1;
          }
LAB_00108cdb:
          local_128 = local_118;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_128,(char)-((int)uVar2 >> 0x1f) + (char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uint)-((int)uVar2 >> 0x1f) + (long)local_128),__len,__val);
          in_RDI = local_90;
          uVar11 = 0xf;
          if (local_108 != &local_f8) {
            uVar11 = local_f8;
          }
          if (uVar11 < (ulong)(local_120 + local_100)) {
            uVar11 = 0xf;
            if (local_128 != local_118) {
              uVar11 = local_118[0];
            }
            if (uVar11 < (ulong)(local_120 + local_100)) goto LAB_00108d71;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_108)
            ;
          }
          else {
LAB_00108d71:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
          }
          local_148 = &local_138;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_138 = *plVar6;
            uStack_130 = puVar7[3];
          }
          else {
            local_138 = *plVar6;
            local_148 = (long *)*puVar7;
          }
          local_140 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
          puVar10 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar10) {
            local_a0 = *puVar10;
            lStack_98 = plVar6[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *puVar10;
            local_b0 = (ulong *)*plVar6;
          }
          local_a8 = plVar6[1];
          *plVar6 = (long)puVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_60.m_ptr = *(PyObject **)(pPVar14->tp_basicsize + 0x70);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_d0,&local_60);
          uVar11 = 0xf;
          if (local_b0 != &local_a0) {
            uVar11 = local_a0;
          }
          if (uVar11 < local_d0._M_string_length + local_a8) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar13 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_d0._M_string_length + local_a8) goto LAB_00108eb5;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
          }
          else {
LAB_00108eb5:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
          }
          local_168._0_8_ = local_168 + 0x10;
          pPVar5 = (PyObject *)(plVar6 + 2);
          if ((PyObject *)*plVar6 == pPVar5) {
            local_168._16_8_ = pPVar5->ob_refcnt;
            oStack_150.super_handle.m_ptr = (handle)plVar6[3];
          }
          else {
            local_168._16_8_ = pPVar5->ob_refcnt;
            local_168._0_8_ = (PyObject *)*plVar6;
          }
          local_168._8_8_ = plVar6[1];
          *plVar6 = (long)pPVar5;
          plVar6[1] = 0;
          *(undefined1 *)&pPVar5->ob_refcnt = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_168);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          psVar12 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_188.field_2._M_allocated_capacity = *psVar12;
            local_188.field_2._8_8_ = plVar6[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar12;
            local_188._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_188._M_string_length = plVar6[1];
          *plVar6 = (long)psVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((PyObject *)local_168._0_8_ != (PyObject *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_128 != local_118) {
            operator_delete(local_128,local_118[0] + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88,local_78 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pPVar14 = (PyTypeObject *)pPVar14->tp_name;
        } while (pPVar14 != (PyTypeObject *)0x0);
      }
    }
    error_scope::~error_scope(&local_e8);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}